

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_chart_begin_colored
                  (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
                  float min_value,float max_value)

{
  nk_vec2 nVar1;
  int iVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_rect r;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  nk_widget_layout_states nVar9;
  nk_bool nVar10;
  nk_command_buffer *b;
  float fVar11;
  float fVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  nk_rect nVar15;
  nk_rect bounds;
  nk_rect r_00;
  
  bounds.x = 0.0;
  bounds.y = 0.0;
  bounds.w = 0.0;
  bounds.h = 0.0;
  nVar10 = 0;
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (nVar10 = 0, ctx->current->layout != (nk_panel *)0x0)) {
    nVar9 = nk_widget(&bounds,ctx);
    pnVar3 = ctx->current;
    pnVar4 = pnVar3->layout;
    if (nVar9 == NK_WIDGET_INVALID) {
      nk_zero(&pnVar4->chart,0xb4);
    }
    else {
      nk_zero(&pnVar4->chart,0xb4);
      uVar7 = bounds._8_8_;
      uVar5 = bounds._0_8_;
      nVar1 = (ctx->style).chart.padding;
      fVar11 = nVar1.x;
      fVar14 = nVar1.y;
      (pnVar4->chart).x = bounds.x + fVar11;
      (pnVar4->chart).y = bounds.y + fVar14;
      auVar12._0_4_ = fVar11 + fVar11;
      auVar12._4_4_ = fVar14 + fVar14;
      auVar12._8_8_ = 0;
      auVar13._4_4_ = bounds.h - auVar12._4_4_;
      auVar13._0_4_ = bounds.w - auVar12._0_4_;
      auVar13._8_8_ = 0;
      auVar13 = maxps(auVar12,auVar13);
      (pnVar4->chart).w = (float)(int)auVar13._0_8_;
      (pnVar4->chart).h = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
      iVar2 = (pnVar4->chart).slot;
      (pnVar4->chart).slot = iVar2 + 1;
      (pnVar4->chart).slots[iVar2].type = type;
      (pnVar4->chart).slots[iVar2].count = count;
      (pnVar4->chart).slots[iVar2].color = color;
      (pnVar4->chart).slots[iVar2].highlight = highlight;
      fVar11 = min_value;
      if (max_value <= min_value) {
        fVar11 = max_value;
      }
      (pnVar4->chart).slots[iVar2].min = fVar11;
      if (max_value <= min_value) {
        max_value = min_value;
      }
      (pnVar4->chart).slots[iVar2].max = max_value;
      (pnVar4->chart).slots[iVar2].range = max_value - fVar11;
      b = &pnVar3->buffer;
      if ((ctx->style).chart.background.type == NK_STYLE_ITEM_IMAGE) {
        r.w = bounds.w;
        r.h = bounds.h;
        r.x = bounds.x;
        r.y = bounds.y;
        nk_draw_image(b,r,&(ctx->style).chart.background.data.image,(nk_color)0xffffffff);
      }
      else {
        nVar15.w = bounds.w;
        nVar15.h = bounds.h;
        nVar15.x = bounds.x;
        nVar15.y = bounds.y;
        nk_fill_rect(b,nVar15,(ctx->style).chart.rounding,(ctx->style).chart.border_color);
        uVar8 = bounds._8_8_;
        uVar6 = bounds._0_8_;
        bounds.w = (float)uVar7;
        bounds.h = SUB84(uVar7,4);
        r_00.w = bounds.w;
        r_00.h = bounds.h;
        bounds.x = (float)uVar5;
        bounds.y = SUB84(uVar5,4);
        r_00.x = bounds.x;
        r_00.y = bounds.y;
        bounds._0_8_ = uVar6;
        bounds._8_8_ = uVar8;
        nVar15 = nk_shrink_rect(r_00,(ctx->style).chart.border);
        nk_fill_rect(b,nVar15,(ctx->style).chart.rounding,(ctx->style).chart.background.data.color);
      }
      nVar10 = 1;
    }
  }
  return nVar10;
}

Assistant:

NK_API nk_bool
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
struct nk_color color, struct nk_color highlight,
int count, float min_value, float max_value)
{
struct nk_window *win;
struct nk_chart *chart;
const struct nk_style *config;
const struct nk_style_chart *style;

const struct nk_style_item *background;
struct nk_rect bounds = {0, 0, 0, 0};

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);

if (!ctx || !ctx->current || !ctx->current->layout) return 0;
if (!nk_widget(&bounds, ctx)) {
chart = &ctx->current->layout->chart;
nk_zero(chart, sizeof(*chart));
return 0;
}

win = ctx->current;
config = &ctx->style;
chart = &win->layout->chart;
style = &config->chart;

/* setup basic generic chart  */
nk_zero(chart, sizeof(*chart));
chart->x = bounds.x + style->padding.x;
chart->y = bounds.y + style->padding.y;
chart->w = bounds.w - 2 * style->padding.x;
chart->h = bounds.h - 2 * style->padding.y;
chart->w = NK_MAX(chart->w, 2 * style->padding.x);
chart->h = NK_MAX(chart->h, 2 * style->padding.y);

/* add first slot into chart */
{struct nk_chart_slot *slot = &chart->slots[chart->slot++];
slot->type = type;
slot->count = count;
slot->color = color;
slot->highlight = highlight;
slot->min = NK_MIN(min_value, max_value);
slot->max = NK_MAX(min_value, max_value);
slot->range = slot->max - slot->min;}

/* draw chart background */
background = &style->background;
if (background->type == NK_STYLE_ITEM_IMAGE) {
nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
} else {
nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
style->rounding, style->background.data.color);
}
return 1;
}